

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>,int>
          (char (*format_str) [6],duration<long,_std::ratio<1L,_1L>_> *args,int *args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  in_stack_00000200;
  basic_string_view<char> in_stack_00000210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  char (*in_stack_ffffffffffffff98) [6];
  checked_args<char[6],_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_int>
  *in_stack_ffffffffffffffa0;
  
  args_00 = in_RDI;
  to_string_view<char>((char *)0x1184ce);
  internal::checked_args<char[6],_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_int>::
  checked_args(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (duration<long,_std::ratio<1L,_1L>_> *)args_00,(int *)in_RDI);
  internal::checked_args<char[6],_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_int>::operator*
            ((checked_args<char[6],_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_int> *)
             0x1184fb);
  internal::vformat<char>(in_stack_00000210,in_stack_00000200);
  return args_00;
}

Assistant:

inline std::basic_string<FMT_CHAR(S)> format(
    const S &format_str, const Args &... args) {
  return internal::vformat(
    to_string_view(format_str),
    *internal::checked_args<S, Args...>(format_str, args...));
}